

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int RunPLC(undefined8 param_1,undefined4 param_2,undefined8 param_3,Commandline *param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> command;
  SymbolAccess device;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  unique_ptr<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_> local_200;
  unique_ptr<const_long,_ResourceDeleter<const_long>_> local_1d0;
  undefined1 local_1a8 [128];
  ios_base local_128 [264];
  
  bhf::ads::SymbolAccess::SymbolAccess((SymbolAccess *)&local_200,param_3,param_1,param_2);
  pcVar2 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"plc command is missing","");
  bhf::Commandline::Pop<std::__cxx11::string>(&local_240,param_4,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_240);
  if (iVar3 == 0) {
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"Variable name is missing","");
    bhf::Commandline::Pop<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               param_4,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    iVar3 = bhf::ads::SymbolAccess::Read((string *)&local_200,(ostream *)local_1a8);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_240);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_240);
      if (iVar3 == 0) {
        iVar3 = bhf::ads::SymbolAccess::ShowSymbols((ostream *)&local_200);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
        poVar4 = (ostream *)(local_1a8 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"RunPLC",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(): Unknown PLC command \'",0x19)
        ;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_240._M_dataplus._M_p,local_240._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
        std::__cxx11::stringbuf::str();
        Logger::Log(3,(string *)&local_260);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
        std::ios_base::~ios_base(local_128);
        iVar3 = -1;
      }
      goto LAB_00106a4d;
    }
    paVar1 = &local_260.field_2;
    local_260._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,"Variable name is missing","");
    bhf::Commandline::Pop<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               param_4,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"Value is missing","");
    bhf::Commandline::Pop<std::__cxx11::string>(&local_260,param_4,&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    iVar3 = bhf::ads::SymbolAccess::Write((string *)&local_200,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar1) {
      operator_delete(local_260._M_dataplus._M_p);
    }
  }
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_);
  }
LAB_00106a4d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  std::unique_ptr<const_long,_ResourceDeleter<const_long>_>::~unique_ptr(&local_1d0);
  std::unique_ptr<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>::~unique_ptr(&local_200);
  return iVar3;
}

Assistant:

int RunPLC(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    auto device = bhf::ads::SymbolAccess{ gw, netid, port };
    const auto command = args.Pop<std::string>("plc command is missing");

    if (!command.compare("read-symbol")) {
        const auto name = args.Pop<std::string>("Variable name is missing");
        return device.Read(name, std::cout);
    } else if (!command.compare("write-symbol")) {
        const auto name = args.Pop<std::string>("Variable name is missing");
        const auto value = args.Pop<std::string>("Value is missing");
        return device.Write(name, value);
    } else if (!command.compare("show-symbols")) {
        return device.ShowSymbols(std::cout);
    }
    LOG_ERROR(__FUNCTION__ << "(): Unknown PLC command '" << command << "'\n");
    return -1;
}